

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KvsCommandHandler.hpp
# Opt level: O3

void __thiscall
supermap::cli::ContainsKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::
ContainsKeyHandler(ContainsKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>
                   *this,shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
                         *kvs)

{
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  local_58;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Check if key in keys","");
  local_58.
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (kvs->
            super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_58.
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (kvs->
       super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  (kvs->
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (kvs->
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (element_type *)0x0;
  KvsCommandHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::KvsCommandHandler
            (&this->
              super_KvsCommandHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,
             &local_40,1,&local_58);
  if (local_58.
      super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_KvsCommandHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>).
  super_Handler._vptr_Handler = (_func_int **)&PTR_handle_00128b50;
  return;
}

Assistant:

explicit ContainsKeyHandler(std::shared_ptr<KeyValueStorage<Key, Value, Index>> kvs)
        : KvsCommandHandler<Key, Value, Index>("Check if key in keys", 1, std::move(kvs)) {}